

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model-loader.cpp
# Opt level: O0

void __thiscall
llama_model_loader::llama_model_loader
          (llama_model_loader *this,string *fname,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *splits,bool use_mmap,bool check_tensors,llama_model_kv_override *param_overrides_p,
          llama_model_tensor_buft_override *param_tensor_buft_overrides_p)

{
  uint uVar1;
  bool bVar2;
  ushort uVar3;
  llm_arch arch;
  uint uVar4;
  char *pcVar5;
  undefined8 uVar6;
  runtime_error *prVar7;
  void *pvVar8;
  long lVar9;
  size_type sVar10;
  pointer pgVar11;
  size_type sVar12;
  map<ggml_type,_unsigned_int,_std::less<ggml_type>,_std::allocator<std::pair<const_ggml_type,_unsigned_int>_>_>
  *this_00;
  mapped_type *pmVar13;
  ulong uVar14;
  undefined8 uVar15;
  reference ppVar16;
  byte in_CL;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  uint *in_RDI;
  byte in_R8B;
  long in_R9;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_kv_override>,_false,_true>,_bool>
  pVar17;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>_>,_bool>
  pVar18;
  undefined8 in_stack_00000008;
  pair<const_ggml_type,_unsigned_int> *kv;
  iterator __end1_1;
  iterator __begin1_1;
  map<ggml_type,_unsigned_int,_std::less<ggml_type>,_std::allocator<std::pair<const_ggml_type,_unsigned_int>_>_>
  *__range1_1;
  size_t MAX_VALUE_LEN;
  string value;
  string type_name;
  gguf_type type_1;
  char *name;
  int i;
  uint32_t ftype_val;
  uint16_t sid;
  ggml_type type;
  ggml_tensor *tensor;
  llama_tensor_weight *w;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>
  *it;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight,_llama_model_loader::weight_name_comparer,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>_>_>
  *__range1;
  ggml_type type_max;
  uint32_t n_type_max;
  map<ggml_type,_unsigned_int,_std::less<ggml_type>,_std::allocator<std::pair<const_ggml_type,_unsigned_int>_>_>
  n_type;
  int n_tensors_loaded;
  string tensor_name_1;
  ggml_tensor *cur_1;
  int idx_gguf;
  int kid;
  gguf_context_ptr ctx_gguf;
  gguf_init_params split_params;
  char *fname_split;
  string kv_split_no;
  uint16_t idx;
  uint16_t n_split;
  string tensor_name;
  ggml_tensor *cur;
  gguf_init_params params;
  ggml_context *ctx;
  llama_model_kv_override *p;
  int trace;
  pointer in_stack_fffffffffffff668;
  llama_model_kv_override *in_stack_fffffffffffff670;
  undefined4 in_stack_fffffffffffff678;
  undefined4 in_stack_fffffffffffff67c;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_kv_override>
  *in_stack_fffffffffffff680;
  string *in_stack_fffffffffffff688;
  undefined8 in_stack_fffffffffffff690;
  LLM_KV *in_stack_fffffffffffff698;
  allocator<char> *in_stack_fffffffffffff6a0;
  key_type *in_stack_fffffffffffff6a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff6b0;
  string *in_stack_fffffffffffff6b8;
  undefined4 in_stack_fffffffffffff6c0;
  undefined4 in_stack_fffffffffffff6c4;
  undefined8 in_stack_fffffffffffff6c8;
  undefined1 required;
  undefined4 in_stack_fffffffffffff6d0;
  undefined4 in_stack_fffffffffffff6d4;
  string *in_stack_fffffffffffff6d8;
  undefined7 in_stack_fffffffffffff6e0;
  undefined1 in_stack_fffffffffffff6e7;
  float local_904;
  ggml_tensor *in_stack_fffffffffffff710;
  undefined4 in_stack_fffffffffffff718;
  undefined4 in_stack_fffffffffffff71c;
  undefined8 in_stack_fffffffffffff720;
  llama_file *in_stack_fffffffffffff728;
  undefined4 in_stack_fffffffffffff730;
  undefined4 in_stack_fffffffffffff734;
  mapped_type mVar19;
  ggml_tensor *in_stack_fffffffffffff7a8;
  undefined8 in_stack_fffffffffffff800;
  string *in_stack_fffffffffffff808;
  _Self local_6a8;
  _Self local_6a0;
  undefined1 *local_698;
  allocator<char> local_689;
  string local_688 [12];
  int in_stack_fffffffffffff984;
  gguf_context *in_stack_fffffffffffff988;
  allocator<char> local_661;
  string local_660 [32];
  string local_640 [32];
  string local_620 [32];
  undefined8 local_600;
  string local_5f8 [38];
  byte local_5d2;
  allocator<char> local_5d1;
  string local_5d0 [36];
  int local_5ac;
  undefined8 local_5a8;
  uint local_5a0;
  uint local_59c;
  string local_598 [34];
  ushort local_576;
  ggml_type local_574;
  ggml_tensor *local_570;
  llama_tensor_weight *local_568;
  reference local_560;
  _Self local_558;
  _Self local_550;
  uint *local_548;
  ggml_type local_540;
  mapped_type local_53c;
  undefined1 local_538 [55];
  undefined1 local_501;
  string local_500 [36];
  uint local_4dc;
  string local_4d8 [32];
  _Base_ptr local_4b8;
  undefined1 local_4b0;
  undefined1 local_489;
  string local_488 [32];
  _Self local_468;
  _Self local_460;
  allocator<char> local_451;
  string local_450 [32];
  long local_430;
  void *local_428;
  undefined1 local_419;
  string local_418 [32];
  uint local_3f8;
  undefined1 local_3f1;
  string local_3f0 [32];
  int local_3d0;
  undefined1 local_3c9;
  string local_3c8 [32];
  undefined4 local_3a8;
  undefined4 uStack_3a4;
  undefined8 uStack_3a0;
  undefined4 local_388;
  undefined4 uStack_384;
  undefined8 *puStack_380;
  undefined8 local_378;
  undefined1 local_369;
  string local_368 [63];
  undefined1 local_329;
  string local_328 [32];
  string local_308 [38];
  ushort local_2e2;
  string local_2e0 [38];
  ushort local_2ba;
  _Base_ptr local_2b8;
  undefined1 local_2b0;
  undefined1 local_289;
  string local_288 [32];
  _Self local_268;
  _Self local_260;
  allocator<char> local_251;
  string local_250 [32];
  long local_230;
  void *local_228;
  LLM_KV local_220;
  string local_210 [39];
  undefined1 local_1e9;
  string local_1e8 [32];
  undefined4 local_1c8;
  undefined4 uStack_1c4;
  undefined4 uStack_1c0;
  undefined4 uStack_1bc;
  undefined4 local_1b8;
  undefined4 uStack_1b4;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_kv_override>,_true>
  local_1a0;
  undefined1 local_198;
  allocator<char> local_189;
  string local_188 [328];
  long local_40;
  int local_38;
  long local_28;
  byte local_1a;
  byte local_19;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  
  local_19 = in_CL & 1;
  local_1a = in_R8B & 1;
  *in_RDI = 0;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  in_RDI[4] = 0;
  in_RDI[5] = 0;
  in_RDI[6] = 0;
  in_RDI[7] = 0;
  *(undefined1 *)(in_RDI + 8) = 0;
  local_28 = in_R9;
  local_18 = in_RDX;
  std::
  vector<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>,_std::allocator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_>_>
  ::vector((vector<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>,_std::allocator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_>_>
            *)0x44e0ce);
  std::
  vector<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>,_std::allocator<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>_>_>
  ::vector((vector<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>,_std::allocator<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>_>_>
            *)0x44e0e7);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight,_llama_model_loader::weight_name_comparer,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight,_llama_model_loader::weight_name_comparer,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>_>_>
         *)0x44e100);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_kv_override,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_kv_override>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_kv_override,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_kv_override>_>_>
                   *)0x44e11c);
  std::unique_ptr<gguf_context,gguf_context_deleter>::unique_ptr<gguf_context_deleter,void>
            ((unique_ptr<gguf_context,_gguf_context_deleter> *)in_stack_fffffffffffff670);
  std::
  vector<std::unique_ptr<ggml_context,_ggml_context_deleter>,_std::allocator<std::unique_ptr<ggml_context,_ggml_context_deleter>_>_>
  ::vector((vector<std::unique_ptr<ggml_context,_ggml_context_deleter>,_std::allocator<std::unique_ptr<ggml_context,_ggml_context_deleter>_>_>
            *)0x44e154);
  std::__cxx11::string::string((string *)(in_RDI + 0x3c));
  LLM_KV::LLM_KV((LLM_KV *)(in_RDI + 0x44),LLM_ARCH_UNKNOWN,(char *)0x0);
  in_RDI[0x48] = 0;
  in_RDI[0x49] = 0;
  in_RDI[0x4a] = 0;
  in_RDI[0x4b] = 0;
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::vector((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            *)0x44e1c1);
  local_38 = 0;
  pcVar5 = getenv("LLAMA_TRACE");
  if (pcVar5 != (char *)0x0) {
    pcVar5 = getenv("LLAMA_TRACE");
    local_38 = atoi(pcVar5);
  }
  if (local_28 != 0) {
    for (local_40 = local_28; *(char *)(local_40 + 4) != '\0'; local_40 = local_40 + 0x108) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff6b0,(char *)in_stack_fffffffffffff6a8,
                 in_stack_fffffffffffff6a0);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_kv_override>
      ::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (in_stack_fffffffffffff680,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),
                 in_stack_fffffffffffff670);
      pVar17 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_kv_override,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_kv_override>_>_>
               ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_kv_override,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_kv_override>_>_>
                         *)in_stack_fffffffffffff680,
                        (value_type *)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678))
      ;
      local_1a0._M_cur =
           (__node_type *)
           pVar17.first.
           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_kv_override>,_true>
           ._M_cur;
      local_198 = pVar17.second;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_kv_override>
      ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_kv_override>
               *)0x44e316);
      std::__cxx11::string::~string(local_188);
      std::allocator<char>::~allocator(&local_189);
    }
  }
  *(undefined8 *)(in_RDI + 0x32) = in_stack_00000008;
  local_1a8 = 0;
  local_1b8 = CONCAT31(local_1b8._1_3_,1);
  uStack_1b0 = &local_1a8;
  uVar6 = std::__cxx11::string::c_str();
  local_1c8 = local_1b8;
  uStack_1c4 = uStack_1b4;
  uStack_1c0 = (undefined4)uStack_1b0;
  uStack_1bc = uStack_1b0._4_4_;
  gguf_init_from_file(uVar6,local_1b8,uStack_1b0);
  std::unique_ptr<gguf_context,_gguf_context_deleter>::reset
            ((unique_ptr<gguf_context,_gguf_context_deleter> *)in_stack_fffffffffffff670,
             in_stack_fffffffffffff668);
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<gguf_context,_gguf_context_deleter> *)0x44e469);
  if (!bVar2) {
    local_1e9 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    uVar6 = std::__cxx11::string::c_str();
    format_abi_cxx11_((char *)local_1e8,"%s: failed to load model from %s\n","llama_model_loader",
                      uVar6);
    std::runtime_error::runtime_error(prVar7,local_1e8);
    local_1e9 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  LLM_KV::operator()[abi_cxx11_
            (in_stack_fffffffffffff698,(llm_kv)((ulong)in_stack_fffffffffffff690 >> 0x20));
  get_key<std::__cxx11::string>
            ((llama_model_loader *)CONCAT17(in_stack_fffffffffffff6e7,in_stack_fffffffffffff6e0),
             in_stack_fffffffffffff6d8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff6d4,in_stack_fffffffffffff6d0),
             SUB81((ulong)in_stack_fffffffffffff6c8 >> 0x38,0));
  std::__cxx11::string::~string(local_210);
  arch = llm_arch_from_string(in_stack_fffffffffffff688);
  LLM_KV::LLM_KV(&local_220,arch,(char *)0x0);
  in_RDI[0x44] = local_220.arch;
  in_RDI[0x45] = local_220._4_4_;
  *(char **)(in_RDI + 0x46) = local_220.suffix;
  pvVar8 = operator_new(8);
  std::__cxx11::string::c_str();
  llama_file::llama_file
            ((llama_file *)in_stack_fffffffffffff670,(char *)in_stack_fffffffffffff668,
             (char *)0x44e64c);
  local_228 = pvVar8;
  std::
  vector<std::unique_ptr<llama_file,std::default_delete<llama_file>>,std::allocator<std::unique_ptr<llama_file,std::default_delete<llama_file>>>>
  ::emplace_back<llama_file*>
            ((vector<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>,_std::allocator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_>_>
              *)in_stack_fffffffffffff680,
             (llama_file **)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678));
  std::
  vector<std::unique_ptr<ggml_context,ggml_context_deleter>,std::allocator<std::unique_ptr<ggml_context,ggml_context_deleter>>>
  ::emplace_back<ggml_context*&>
            ((vector<std::unique_ptr<ggml_context,_ggml_context_deleter>,_std::allocator<std::unique_ptr<ggml_context,_ggml_context_deleter>_>_>
              *)in_stack_fffffffffffff680,
             (ggml_context **)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678));
  for (local_230 = ggml_get_first_tensor(local_1a8); local_230 != 0;
      local_230 = ggml_get_next_tensor(local_1a8,local_230)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff6b0,(char *)in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a0
              );
    std::allocator<char>::~allocator(&local_251);
    local_260._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight,_llama_model_loader::weight_name_comparer,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>_>_>
         ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight,_llama_model_loader::weight_name_comparer,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>_>_>
                 *)in_stack_fffffffffffff668,(key_type *)0x44e739);
    local_268._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight,_llama_model_loader::weight_name_comparer,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight,_llama_model_loader::weight_name_comparer,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>_>_>
                *)in_stack_fffffffffffff668);
    bVar2 = std::operator!=(&local_260,&local_268);
    if (bVar2) {
      local_289 = 1;
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      uVar6 = ggml_get_name(local_230);
      format_abi_cxx11_((char *)local_288,"invalid model: tensor \'%s\' is duplicated",uVar6);
      std::runtime_error::runtime_error(prVar7,local_288);
      local_289 = 0;
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    lVar9 = ggml_nelements(local_230);
    *(long *)(in_RDI + 4) = *(long *)(in_RDI + 4) + lVar9;
    lVar9 = ggml_nbytes(local_230);
    *(long *)(in_RDI + 6) = *(long *)(in_RDI + 6) + lVar9;
    std::
    vector<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>,_std::allocator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_>_>
    ::back((vector<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>,_std::allocator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_>_>
            *)in_stack_fffffffffffff670);
    std::unique_ptr<llama_file,_std::default_delete<llama_file>_>::get
              ((unique_ptr<llama_file,_std::default_delete<llama_file>_> *)in_stack_fffffffffffff670
              );
    std::unique_ptr<gguf_context,_gguf_context_deleter>::get
              ((unique_ptr<gguf_context,_gguf_context_deleter> *)in_stack_fffffffffffff670);
    llama_tensor_weight::llama_tensor_weight
              ((llama_tensor_weight *)CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730),
               in_stack_fffffffffffff728,(uint16_t)((ulong)in_stack_fffffffffffff720 >> 0x30),
               (gguf_context *)CONCAT44(in_stack_fffffffffffff71c,in_stack_fffffffffffff718),
               in_stack_fffffffffffff710);
    pVar18 = std::
             map<std::__cxx11::string,llama_model_loader::llama_tensor_weight,llama_model_loader::weight_name_comparer,std::allocator<std::pair<std::__cxx11::string_const,llama_model_loader::llama_tensor_weight>>>
             ::emplace<std::__cxx11::string&,llama_model_loader::llama_tensor_weight>
                       ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight,_llama_model_loader::weight_name_comparer,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>_>_>
                         *)in_stack_fffffffffffff680,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),
                        (llama_tensor_weight *)in_stack_fffffffffffff670);
    local_2b8 = (_Base_ptr)pVar18.first._M_node;
    local_2b0 = pVar18.second;
    std::__cxx11::string::~string(local_250);
  }
  local_2ba = 0;
  LLM_KV::operator()[abi_cxx11_
            (in_stack_fffffffffffff698,(llm_kv)((ulong)in_stack_fffffffffffff690 >> 0x20));
  get_key<unsigned_short>
            ((llama_model_loader *)CONCAT17(in_stack_fffffffffffff6e7,in_stack_fffffffffffff6e0),
             in_stack_fffffffffffff6d8,
             (unsigned_short *)CONCAT44(in_stack_fffffffffffff6d4,in_stack_fffffffffffff6d0),
             SUB81((ulong)in_stack_fffffffffffff6c8 >> 0x38,0));
  std::__cxx11::string::~string(local_2e0);
  if (1 < local_2ba) {
    local_2e2 = 0;
    LLM_KV::operator()[abi_cxx11_
              (in_stack_fffffffffffff698,(llm_kv)((ulong)in_stack_fffffffffffff690 >> 0x20));
    get_key<unsigned_short>
              ((llama_model_loader *)CONCAT17(in_stack_fffffffffffff6e7,in_stack_fffffffffffff6e0),
               in_stack_fffffffffffff6d8,
               (unsigned_short *)CONCAT44(in_stack_fffffffffffff6d4,in_stack_fffffffffffff6d0),
               SUB81((ulong)in_stack_fffffffffffff6c8 >> 0x38,0));
    if (local_2e2 != 0) {
      local_329 = 1;
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      uVar3 = local_2e2;
      uVar6 = std::__cxx11::string::c_str();
      format_abi_cxx11_((char *)local_328,
                        "illegal split file idx: %d (file: %s), model must be loaded with the first split"
                        ,(ulong)uVar3,uVar6);
      std::runtime_error::runtime_error(prVar7,local_328);
      local_329 = 0;
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    bVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffff680);
    if (bVar2) {
      llama_get_list_splits
                (in_stack_fffffffffffff808,(int)((ulong)in_stack_fffffffffffff800 >> 0x20),
                 (int)in_stack_fffffffffffff800);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffff680,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff680);
    }
    uVar4 = (uint)local_2ba;
    sVar10 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size(local_18);
    if (uVar4 != ((uint)sVar10 & 0xffff)) {
      local_369 = 1;
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      sVar10 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size(local_18);
      format_abi_cxx11_((char *)local_368,"invalid split count, given: %zu splits, but expected %d",
                        sVar10,(ulong)local_2ba);
      std::runtime_error::runtime_error(prVar7,local_368);
      local_369 = 0;
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (0 < local_38) {
      llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: loading additional %d GGUFs\n",
                         "llama_model_loader",(ulong)local_2ba);
    }
    for (local_2e2 = 1; required = (undefined1)((ulong)in_stack_fffffffffffff6c8 >> 0x38),
        local_2e2 < local_2ba; local_2e2 = local_2e2 + 1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](local_18,(ulong)local_2e2);
      local_378 = std::__cxx11::string::c_str();
      local_388 = CONCAT31(local_388._1_3_,1);
      puStack_380 = &local_1a8;
      local_3a8 = local_388;
      uStack_3a4 = uStack_384;
      uStack_3a0 = puStack_380;
      gguf_init_from_file(local_378,local_388,puStack_380);
      std::unique_ptr<gguf_context,gguf_context_deleter>::unique_ptr<gguf_context_deleter,void>
                ((unique_ptr<gguf_context,_gguf_context_deleter> *)in_stack_fffffffffffff670,
                 in_stack_fffffffffffff668);
      bVar2 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<gguf_context,_gguf_context_deleter> *)0x44eeaf);
      if (!bVar2) {
        local_3c9 = 1;
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        format_abi_cxx11_((char *)local_3c8,"%s: failed to load GGUF split from %s\n",
                          "llama_model_loader",local_378);
        std::runtime_error::runtime_error(prVar7,local_3c8);
        local_3c9 = 0;
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pgVar11 = std::unique_ptr<gguf_context,_gguf_context_deleter>::get
                          ((unique_ptr<gguf_context,_gguf_context_deleter> *)
                           in_stack_fffffffffffff670);
      uVar6 = std::__cxx11::string::c_str();
      local_3d0 = gguf_find_key(pgVar11,uVar6);
      if (local_3d0 < 0) {
        local_3f1 = 1;
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        uVar6 = std::__cxx11::string::c_str();
        format_abi_cxx11_((char *)local_3f0,"missing key %s in GGUF split %s",uVar6,local_378);
        std::runtime_error::runtime_error(prVar7,local_3f0);
        local_3f1 = 0;
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pgVar11 = std::unique_ptr<gguf_context,_gguf_context_deleter>::get
                          ((unique_ptr<gguf_context,_gguf_context_deleter> *)
                           in_stack_fffffffffffff670);
      uVar3 = gguf_get_val_u16(pgVar11,(long)local_3d0);
      local_3f8 = (uint)uVar3;
      if (local_3f8 != local_2e2) {
        local_419 = 1;
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        format_abi_cxx11_((char *)local_418,"invalid split file idx: %d (file: %s), expected %d",
                          (ulong)local_3f8,local_378,(ulong)local_2e2);
        std::runtime_error::runtime_error(prVar7,local_418);
        local_419 = 0;
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pvVar8 = operator_new(8);
      llama_file::llama_file
                ((llama_file *)in_stack_fffffffffffff670,(char *)in_stack_fffffffffffff668,
                 (char *)0x44f24e);
      local_428 = pvVar8;
      std::
      vector<std::unique_ptr<llama_file,std::default_delete<llama_file>>,std::allocator<std::unique_ptr<llama_file,std::default_delete<llama_file>>>>
      ::emplace_back<llama_file*>
                ((vector<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>,_std::allocator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_>_>
                  *)in_stack_fffffffffffff680,
                 (llama_file **)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678));
      std::
      vector<std::unique_ptr<ggml_context,ggml_context_deleter>,std::allocator<std::unique_ptr<ggml_context,ggml_context_deleter>>>
      ::emplace_back<ggml_context*&>
                ((vector<std::unique_ptr<ggml_context,_ggml_context_deleter>,_std::allocator<std::unique_ptr<ggml_context,_ggml_context_deleter>_>_>
                  *)in_stack_fffffffffffff680,
                 (ggml_context **)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678));
      local_430 = ggml_get_first_tensor(local_1a8);
      while (local_430 != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff6b0,(char *)in_stack_fffffffffffff6a8,
                   in_stack_fffffffffffff6a0);
        std::allocator<char>::~allocator(&local_451);
        local_460._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight,_llama_model_loader::weight_name_comparer,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>_>_>
             ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight,_llama_model_loader::weight_name_comparer,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>_>_>
                     *)in_stack_fffffffffffff668,(key_type *)0x44f33b);
        local_468._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight,_llama_model_loader::weight_name_comparer,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>_>_>
             ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight,_llama_model_loader::weight_name_comparer,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>_>_>
                    *)in_stack_fffffffffffff668);
        bVar2 = std::operator!=(&local_460,&local_468);
        if (bVar2) {
          local_489 = 1;
          prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
          uVar6 = ggml_get_name(local_430);
          format_abi_cxx11_((char *)local_488,"invalid model: tensor \'%s\' is duplicated",uVar6);
          std::runtime_error::runtime_error(prVar7,local_488);
          local_489 = 0;
          __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        in_stack_fffffffffffff7a8 = (ggml_tensor *)ggml_nelements(local_430);
        *(long *)(in_RDI + 4) = (long)in_stack_fffffffffffff7a8->ne + *(long *)(in_RDI + 4) + -0x10;
        lVar9 = ggml_nbytes(local_430);
        *(long *)(in_RDI + 6) = *(long *)(in_RDI + 6) + lVar9;
        std::
        vector<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>,_std::allocator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_>_>
        ::back((vector<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>,_std::allocator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_>_>
                *)in_stack_fffffffffffff670);
        std::unique_ptr<llama_file,_std::default_delete<llama_file>_>::get
                  ((unique_ptr<llama_file,_std::default_delete<llama_file>_> *)
                   in_stack_fffffffffffff670);
        std::unique_ptr<gguf_context,_gguf_context_deleter>::get
                  ((unique_ptr<gguf_context,_gguf_context_deleter> *)in_stack_fffffffffffff670);
        llama_tensor_weight::llama_tensor_weight
                  ((llama_tensor_weight *)
                   CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730),
                   in_stack_fffffffffffff728,(uint16_t)((ulong)in_stack_fffffffffffff720 >> 0x30),
                   (gguf_context *)CONCAT44(in_stack_fffffffffffff71c,in_stack_fffffffffffff718),
                   in_stack_fffffffffffff710);
        pVar18 = std::
                 map<std::__cxx11::string,llama_model_loader::llama_tensor_weight,llama_model_loader::weight_name_comparer,std::allocator<std::pair<std::__cxx11::string_const,llama_model_loader::llama_tensor_weight>>>
                 ::emplace<std::__cxx11::string&,llama_model_loader::llama_tensor_weight>
                           ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight,_llama_model_loader::weight_name_comparer,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>_>_>
                             *)in_stack_fffffffffffff680,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),
                            (llama_tensor_weight *)in_stack_fffffffffffff670);
        local_4b8 = (_Base_ptr)pVar18.first._M_node;
        local_4b0 = pVar18.second;
        std::__cxx11::string::~string(local_450);
        local_430 = ggml_get_next_tensor(local_1a8,local_430);
      }
      std::unique_ptr<gguf_context,_gguf_context_deleter>::~unique_ptr
                ((unique_ptr<gguf_context,_gguf_context_deleter> *)in_stack_fffffffffffff680);
    }
    LLM_KV::operator()[abi_cxx11_
              (in_stack_fffffffffffff698,(llm_kv)((ulong)in_stack_fffffffffffff690 >> 0x20));
    get_key<int>((llama_model_loader *)CONCAT17(in_stack_fffffffffffff6e7,in_stack_fffffffffffff6e0)
                 ,in_stack_fffffffffffff6d8,
                 (int *)CONCAT44(in_stack_fffffffffffff6d4,in_stack_fffffffffffff6d0),(bool)required
                );
    std::__cxx11::string::~string(local_4d8);
    sVar12 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight,_llama_model_loader::weight_name_comparer,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>_>_>
             ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight,_llama_model_loader::weight_name_comparer,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>_>_>
                     *)0x44f6e4);
    local_4dc = (uint)sVar12;
    if (in_RDI[1] != local_4dc) {
      local_501 = 1;
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      format_abi_cxx11_((char *)local_500,"corrupted model: %d tensors expected but %d found",
                        (ulong)in_RDI[1],(ulong)local_4dc);
      std::runtime_error::runtime_error(prVar7,local_500);
      local_501 = 0;
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: additional %d GGUFs metadata loaded.\n",
                       "llama_model_loader",(ulong)(local_2ba - 1));
    std::__cxx11::string::~string(local_308);
  }
  pgVar11 = std::unique_ptr<gguf_context,_gguf_context_deleter>::get
                      ((unique_ptr<gguf_context,_gguf_context_deleter> *)in_stack_fffffffffffff670);
  uVar4 = gguf_get_n_kv(pgVar11);
  *in_RDI = uVar4;
  sVar12 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight,_llama_model_loader::weight_name_comparer,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>_>_>
           ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight,_llama_model_loader::weight_name_comparer,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>_>_>
                   *)0x44f88c);
  in_RDI[1] = (uint)sVar12;
  pgVar11 = std::unique_ptr<gguf_context,_gguf_context_deleter>::get
                      ((unique_ptr<gguf_context,_gguf_context_deleter> *)in_stack_fffffffffffff670);
  uVar4 = gguf_get_version(pgVar11);
  in_RDI[0x11] = uVar4;
  uVar4 = *in_RDI;
  uVar1 = in_RDI[1];
  uVar6 = std::__cxx11::string::c_str();
  this_00 = (map<ggml_type,_unsigned_int,_std::less<ggml_type>,_std::allocator<std::pair<const_ggml_type,_unsigned_int>_>_>
             *)llama_file_version_name(in_RDI[0x11]);
  llama_log_internal(GGML_LOG_LEVEL_INFO,
                     "%s: loaded meta data with %d key-value pairs and %d tensors from %s (version %s)\n"
                     ,"llama_model_loader",(ulong)uVar4,(ulong)uVar1,uVar6);
  std::
  map<ggml_type,_unsigned_int,_std::less<ggml_type>,_std::allocator<std::pair<const_ggml_type,_unsigned_int>_>_>
  ::map((map<ggml_type,_unsigned_int,_std::less<ggml_type>,_std::allocator<std::pair<const_ggml_type,_unsigned_int>_>_>
         *)0x44f94a);
  local_53c = 0;
  local_540 = GGML_TYPE_F32;
  local_548 = in_RDI + 0x18;
  local_550._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight,_llama_model_loader::weight_name_comparer,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight,_llama_model_loader::weight_name_comparer,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>_>_>
                *)this_00);
  local_558._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight,_llama_model_loader::weight_name_comparer,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight,_llama_model_loader::weight_name_comparer,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>_>_>
              *)this_00);
  while( true ) {
    bVar2 = std::operator!=(&local_550,&local_558);
    if (!bVar2) break;
    local_560 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>_>
                ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>_>
                             *)0x44f9c9);
    local_568 = &local_560->second;
    local_570 = (local_560->second).tensor;
    local_574 = local_570->type;
    pmVar13 = std::
              map<ggml_type,_unsigned_int,_std::less<ggml_type>,_std::allocator<std::pair<const_ggml_type,_unsigned_int>_>_>
              ::operator[]((map<ggml_type,_unsigned_int,_std::less<ggml_type>,_std::allocator<std::pair<const_ggml_type,_unsigned_int>_>_>
                            *)in_stack_fffffffffffff6b0,in_stack_fffffffffffff6a8);
    *pmVar13 = *pmVar13 + 1;
    mVar19 = local_53c;
    pmVar13 = std::
              map<ggml_type,_unsigned_int,_std::less<ggml_type>,_std::allocator<std::pair<const_ggml_type,_unsigned_int>_>_>
              ::operator[]((map<ggml_type,_unsigned_int,_std::less<ggml_type>,_std::allocator<std::pair<const_ggml_type,_unsigned_int>_>_>
                            *)in_stack_fffffffffffff6b0,in_stack_fffffffffffff6a8);
    if (mVar19 < *pmVar13) {
      pmVar13 = std::
                map<ggml_type,_unsigned_int,_std::less<ggml_type>,_std::allocator<std::pair<const_ggml_type,_unsigned_int>_>_>
                ::operator[]((map<ggml_type,_unsigned_int,_std::less<ggml_type>,_std::allocator<std::pair<const_ggml_type,_unsigned_int>_>_>
                              *)in_stack_fffffffffffff6b0,in_stack_fffffffffffff6a8);
      local_53c = *pmVar13;
      local_540 = local_574;
    }
    if (0 < local_38) {
      local_576 = local_568->idx;
      uVar4 = (uint)local_576;
      uVar6 = ggml_get_name(local_570);
      uVar15 = ggml_type_name(local_574);
      llama_format_tensor_shape_abi_cxx11_(in_stack_fffffffffffff7a8);
      this_00 = (map<ggml_type,_unsigned_int,_std::less<ggml_type>,_std::allocator<std::pair<const_ggml_type,_unsigned_int>_>_>
                 *)std::__cxx11::string::c_str();
      uVar14 = ggml_nbytes(local_570);
      local_904 = (float)uVar14;
      llama_log_internal(SUB84((double)(local_904 * 0.0009765625 * 0.0009765625),0),(char *)0x2,
                         "%s: - tensor split %2d: %32s %-8s [ %s ] %8.2f MiB\n","llama_model_loader"
                         ,(ulong)uVar4,uVar6,uVar15);
      std::__cxx11::string::~string(local_598);
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>_>
                  *)in_stack_fffffffffffff670);
  }
  switch(local_540) {
  case GGML_TYPE_F32:
    in_RDI[0x10] = 0;
    break;
  case GGML_TYPE_F16:
    in_RDI[0x10] = 1;
    break;
  case GGML_TYPE_Q4_0:
    in_RDI[0x10] = 2;
    break;
  case GGML_TYPE_Q4_1:
    in_RDI[0x10] = 3;
    break;
  default:
    uVar6 = ggml_type_name(local_540);
    llama_log_internal(GGML_LOG_LEVEL_WARN,"%s: unknown type %s\n","llama_model_loader",uVar6);
    in_RDI[0x10] = 0;
    break;
  case GGML_TYPE_Q5_0:
    in_RDI[0x10] = 8;
    break;
  case GGML_TYPE_Q5_1:
    in_RDI[0x10] = 9;
    break;
  case GGML_TYPE_Q8_0:
    in_RDI[0x10] = 7;
    break;
  case GGML_TYPE_Q2_K:
    in_RDI[0x10] = 10;
    break;
  case GGML_TYPE_Q3_K:
    in_RDI[0x10] = 0xc;
    break;
  case GGML_TYPE_Q4_K:
    in_RDI[0x10] = 0xf;
    break;
  case GGML_TYPE_Q5_K:
    in_RDI[0x10] = 0x11;
    break;
  case GGML_TYPE_Q6_K:
    in_RDI[0x10] = 0x12;
    break;
  case GGML_TYPE_IQ2_XXS:
    in_RDI[0x10] = 0x13;
    break;
  case GGML_TYPE_IQ2_XS:
    in_RDI[0x10] = 0x14;
    break;
  case GGML_TYPE_IQ3_XXS:
    in_RDI[0x10] = 0x17;
    break;
  case GGML_TYPE_IQ1_S:
    in_RDI[0x10] = 0x18;
    break;
  case GGML_TYPE_IQ4_NL:
    in_RDI[0x10] = 0x19;
    break;
  case GGML_TYPE_IQ3_S:
    in_RDI[0x10] = 0x1a;
    break;
  case GGML_TYPE_IQ2_S:
    in_RDI[0x10] = 0x1c;
    break;
  case GGML_TYPE_IQ4_XS:
    in_RDI[0x10] = 0x1e;
    break;
  case GGML_TYPE_IQ1_M:
    in_RDI[0x10] = 0x1f;
    break;
  case GGML_TYPE_BF16:
    in_RDI[0x10] = 0x20;
    break;
  case GGML_TYPE_TQ1_0:
    in_RDI[0x10] = 0x24;
    break;
  case GGML_TYPE_TQ2_0:
    in_RDI[0x10] = 0x25;
  }
  *(byte *)((long)in_RDI + 0x41) = *(byte *)((long)in_RDI + 0x41) | 4;
  local_59c = 0;
  bVar2 = get_key<unsigned_int>
                    ((llama_model_loader *)
                     CONCAT44(in_stack_fffffffffffff6c4,in_stack_fffffffffffff6c0),
                     (llm_kv)((ulong)in_stack_fffffffffffff6b8 >> 0x20),
                     (uint *)in_stack_fffffffffffff6b0,
                     SUB81((ulong)in_stack_fffffffffffff6a8 >> 0x38,0));
  if (bVar2) {
    in_RDI[0x10] = local_59c;
  }
  llama_log_internal(GGML_LOG_LEVEL_INFO,
                     "%s: Dumping metadata keys/values. Note: KV overrides do not apply in this output.\n"
                     ,"llama_model_loader");
  for (local_5a0 = 0; (int)local_5a0 < (int)*in_RDI; local_5a0 = local_5a0 + 1) {
    pgVar11 = std::unique_ptr<gguf_context,_gguf_context_deleter>::get
                        ((unique_ptr<gguf_context,_gguf_context_deleter> *)in_stack_fffffffffffff670
                        );
    local_5a8 = gguf_get_key(pgVar11,(long)(int)local_5a0);
    pgVar11 = std::unique_ptr<gguf_context,_gguf_context_deleter>::get
                        ((unique_ptr<gguf_context,_gguf_context_deleter> *)in_stack_fffffffffffff670
                        );
    local_5ac = gguf_get_kv_type(pgVar11,(long)(int)local_5a0);
    local_5d2 = 0;
    if (local_5ac == 9) {
      uVar6 = gguf_type_name(9);
      pgVar11 = std::unique_ptr<gguf_context,_gguf_context_deleter>::get
                          ((unique_ptr<gguf_context,_gguf_context_deleter> *)
                           in_stack_fffffffffffff670);
      in_stack_fffffffffffff6c4 = gguf_get_arr_type(pgVar11,(long)(int)local_5a0);
      in_stack_fffffffffffff6b8 = (string *)gguf_type_name(in_stack_fffffffffffff6c4);
      pgVar11 = std::unique_ptr<gguf_context,_gguf_context_deleter>::get
                          ((unique_ptr<gguf_context,_gguf_context_deleter> *)
                           in_stack_fffffffffffff670);
      in_stack_fffffffffffff6b0 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           gguf_get_arr_n(pgVar11,(long)(int)local_5a0);
      format_abi_cxx11_((char *)local_5d0,"%s[%s,%zu]",uVar6,in_stack_fffffffffffff6b8,
                        in_stack_fffffffffffff6b0);
    }
    else {
      in_stack_fffffffffffff6a8 = (key_type *)gguf_type_name(local_5ac);
      in_stack_fffffffffffff6a0 = &local_5d1;
      std::allocator<char>::allocator();
      local_5d2 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff6b0,(char *)in_stack_fffffffffffff6a8,
                 in_stack_fffffffffffff6a0);
    }
    if ((local_5d2 & 1) != 0) {
      std::allocator<char>::~allocator(&local_5d1);
    }
    std::unique_ptr<gguf_context,_gguf_context_deleter>::get
              ((unique_ptr<gguf_context,_gguf_context_deleter> *)in_stack_fffffffffffff670);
    gguf_kv_to_str_abi_cxx11_(in_stack_fffffffffffff988,in_stack_fffffffffffff984);
    local_600 = 0x28;
    uVar14 = std::__cxx11::string::size();
    if (0x28 < uVar14) {
      std::__cxx11::string::substr((ulong)local_640,(ulong)local_5f8);
      uVar6 = std::__cxx11::string::c_str();
      format_abi_cxx11_((char *)local_620,"%s...",uVar6);
      std::__cxx11::string::operator=(local_5f8,local_620);
      std::__cxx11::string::~string(local_620);
      std::__cxx11::string::~string(local_640);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff6b0,(char *)in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a0
              );
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff6b0,(char *)in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a0
              );
    replace_all((string *)CONCAT44(in_stack_fffffffffffff6c4,in_stack_fffffffffffff6c0),
                in_stack_fffffffffffff6b8,in_stack_fffffffffffff6b0);
    std::__cxx11::string::~string(local_688);
    std::allocator<char>::~allocator(&local_689);
    std::__cxx11::string::~string(local_660);
    std::allocator<char>::~allocator(&local_661);
    uVar4 = local_5a0;
    uVar6 = local_5a8;
    uVar15 = std::__cxx11::string::c_str();
    this_00 = (map<ggml_type,_unsigned_int,_std::less<ggml_type>,_std::allocator<std::pair<const_ggml_type,_unsigned_int>_>_>
               *)std::__cxx11::string::c_str();
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: - kv %3d: %42s %-16s = %s\n","llama_model_loader",
                       (ulong)uVar4,uVar6,uVar15);
    std::__cxx11::string::~string(local_5f8);
    std::__cxx11::string::~string(local_5d0);
  }
  local_698 = local_538;
  local_6a0._M_node =
       (_Base_ptr)
       std::
       map<ggml_type,_unsigned_int,_std::less<ggml_type>,_std::allocator<std::pair<const_ggml_type,_unsigned_int>_>_>
       ::begin(this_00);
  local_6a8._M_node =
       (_Base_ptr)
       std::
       map<ggml_type,_unsigned_int,_std::less<ggml_type>,_std::allocator<std::pair<const_ggml_type,_unsigned_int>_>_>
       ::end(this_00);
  while( true ) {
    bVar2 = std::operator!=(&local_6a0,&local_6a8);
    if (!bVar2) break;
    ppVar16 = std::_Rb_tree_iterator<std::pair<const_ggml_type,_unsigned_int>_>::operator*
                        ((_Rb_tree_iterator<std::pair<const_ggml_type,_unsigned_int>_> *)0x45045a);
    if (ppVar16->second != 0) {
      in_stack_fffffffffffff670 = (llama_model_kv_override *)ggml_type_name(ppVar16->first);
      llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: - type %4s: %4d tensors\n","llama_model_loader",
                         in_stack_fffffffffffff670,(ulong)ppVar16->second);
    }
    std::_Rb_tree_iterator<std::pair<const_ggml_type,_unsigned_int>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_ggml_type,_unsigned_int>_> *)
               in_stack_fffffffffffff670);
  }
  std::
  map<ggml_type,_unsigned_int,_std::less<ggml_type>,_std::allocator<std::pair<const_ggml_type,_unsigned_int>_>_>
  ::~map((map<ggml_type,_unsigned_int,_std::less<ggml_type>,_std::allocator<std::pair<const_ggml_type,_unsigned_int>_>_>
          *)0x4504d6);
  *(byte *)(in_RDI + 8) = local_19 & 1;
  *(byte *)((long)in_RDI + 0x21) = local_1a & 1;
  return;
}

Assistant:

llama_model_loader::llama_model_loader(
        const std::string & fname,
        std::vector<std::string> & splits,
        bool use_mmap,
        bool check_tensors,
        const llama_model_kv_override * param_overrides_p,
        const llama_model_tensor_buft_override * param_tensor_buft_overrides_p) {
    int trace = 0;
    if (getenv("LLAMA_TRACE")) {
        trace = atoi(getenv("LLAMA_TRACE"));
    }

    if (param_overrides_p != nullptr) {
        for (const struct llama_model_kv_override * p = param_overrides_p; p->key[0] != 0; p++) {
            kv_overrides.insert({std::string(p->key), *p});
        }
    }

    tensor_buft_overrides = param_tensor_buft_overrides_p;

    // Load the main GGUF
    struct ggml_context * ctx = NULL;
    struct gguf_init_params params = {
        /*.no_alloc = */ true,
        /*.ctx      = */ &ctx,
    };

    meta.reset(gguf_init_from_file(fname.c_str(), params));
    if (!meta) {
        throw std::runtime_error(format("%s: failed to load model from %s\n", __func__, fname.c_str()));
    }

    get_key(llm_kv(LLM_KV_GENERAL_ARCHITECTURE), arch_name, false);
    llm_kv = LLM_KV(llm_arch_from_string(arch_name));

    files.emplace_back(new llama_file(fname.c_str(), "rb"));
    contexts.emplace_back(ctx);

    // Save tensors data offset of the main file.
    // For subsidiary files, `meta` tensor data offset must not be used,
    // so we build a unified tensors index for weights.
    for (ggml_tensor * cur = ggml_get_first_tensor(ctx); cur; cur = ggml_get_next_tensor(ctx, cur)) {
        std::string tensor_name = std::string(cur->name);
        // make sure there is no duplicated tensor names
        if (weights_map.find(tensor_name) != weights_map.end()) {
            throw std::runtime_error(format("invalid model: tensor '%s' is duplicated", ggml_get_name(cur)));
        }
        n_elements += ggml_nelements(cur);
        n_bytes    += ggml_nbytes(cur);
        weights_map.emplace(tensor_name, llama_tensor_weight(files.back().get(), 0, meta.get(), cur));
    }
    uint16_t n_split = 0;
    get_key(llm_kv(LLM_KV_SPLIT_COUNT), n_split, false);

    // Load additional GGML contexts
    if (n_split > 1) {
        // make sure the main file is loaded first
        uint16_t idx = 0;
        const std::string kv_split_no = llm_kv(LLM_KV_SPLIT_NO);
        get_key(kv_split_no, idx);
        if (idx != 0) {
            throw std::runtime_error(format("illegal split file idx: %d (file: %s), model must be loaded with the first split", idx, fname.c_str()));
        }

        // generate list of splits if needed
        if (splits.empty()) {
            splits = llama_get_list_splits(fname, idx, n_split);
        }

        // in case user give a custom list of splits, check if it matches the expected number
        if (n_split != (uint16_t)splits.size()) {
            throw std::runtime_error(format("invalid split count, given: %zu splits, but expected %d", splits.size(), n_split));
        }

        if (trace > 0) {
            LLAMA_LOG_INFO("%s: loading additional %d GGUFs\n", __func__, n_split);
        }

        // load other splits
        for (idx = 1; idx < n_split; idx++) {
            const char * fname_split = splits[idx].c_str();

            struct gguf_init_params split_params = {
                /*.no_alloc = */ true,
                /*.ctx      = */ &ctx,
            };
            gguf_context_ptr ctx_gguf { gguf_init_from_file(fname_split, split_params) };
            if (!ctx_gguf) {
                throw std::runtime_error(format("%s: failed to load GGUF split from %s\n", __func__, fname_split));
            }

            // check idx
            {
                const int kid = gguf_find_key(ctx_gguf.get(), kv_split_no.c_str());
                if (kid < 0) {
                    throw std::runtime_error(format("missing key %s in GGUF split %s", kv_split_no.c_str(), fname_split));
                }
                int idx_gguf = gguf_get_val_u16(ctx_gguf.get(), kid);
                if (idx_gguf != idx) {
                    throw std::runtime_error(format("invalid split file idx: %d (file: %s), expected %d", idx_gguf, fname_split, idx));
                }
            }

            files.emplace_back(new llama_file(fname_split, "rb"));
            contexts.emplace_back(ctx);

            // Save tensors data offset info of the shard.
            for (ggml_tensor * cur = ggml_get_first_tensor(ctx); cur; cur = ggml_get_next_tensor(ctx, cur)) {
                std::string tensor_name = std::string(cur->name);
                // make sure there is no duplicated tensor names
                if (weights_map.find(tensor_name) != weights_map.end()) {
                    throw std::runtime_error(format("invalid model: tensor '%s' is duplicated", ggml_get_name(cur)));
                }
                n_elements += ggml_nelements(cur);
                n_bytes    += ggml_nbytes(cur);
                weights_map.emplace(tensor_name, llama_tensor_weight(files.back().get(), idx, ctx_gguf.get(), cur));
            }
        }

        get_key(llm_kv(LLM_KV_SPLIT_TENSORS_COUNT), n_tensors);

        // sanity check
        {
            const int n_tensors_loaded = (int) weights_map.size();
            if (n_tensors != n_tensors_loaded) {
                throw std::runtime_error(format("corrupted model: %d tensors expected but %d found", n_tensors, n_tensors_loaded));
            }
        }

        LLAMA_LOG_INFO("%s: additional %d GGUFs metadata loaded.\n",  __func__, n_split - 1);
    }

    n_kv      = gguf_get_n_kv(meta.get());
    n_tensors = weights_map.size();

    fver = (enum llama_fver) gguf_get_version(meta.get());

    LLAMA_LOG_INFO("%s: loaded meta data with %d key-value pairs and %d tensors from %s (version %s)\n",
            __func__, n_kv, n_tensors, fname.c_str(), llama_file_version_name(fver));

    // determine file type based on the number of tensors for each quantization and print meta data
    // TODO: make optional
    {
        std::map<enum ggml_type, uint32_t> n_type;

        uint32_t n_type_max = 0;
        enum ggml_type type_max = GGML_TYPE_F32;

        for (const auto & it : weights_map) {
            const llama_tensor_weight & w = it.second;
            const ggml_tensor * tensor = w.tensor;

            enum ggml_type type = tensor->type;

            n_type[type]++;

            if (n_type_max < n_type[type]) {
                n_type_max = n_type[type];
                type_max   = type;
            }

            if (trace > 0) {
                const uint16_t sid = w.idx;
                LLAMA_LOG_INFO("%s: - tensor split %2d: %32s %-8s [ %s ] %8.2f MiB\n", __func__,
                        sid, ggml_get_name(tensor), ggml_type_name(type), llama_format_tensor_shape(tensor).c_str(),
                        ggml_nbytes(tensor)/1024.0f/1024.0f);
            }
        }

        switch (type_max) {
            case GGML_TYPE_F32:     ftype = LLAMA_FTYPE_ALL_F32;        break;
            case GGML_TYPE_F16:     ftype = LLAMA_FTYPE_MOSTLY_F16;     break;
            case GGML_TYPE_BF16:    ftype = LLAMA_FTYPE_MOSTLY_BF16;    break;
            case GGML_TYPE_Q4_0:    ftype = LLAMA_FTYPE_MOSTLY_Q4_0;    break;
            case GGML_TYPE_Q4_1:    ftype = LLAMA_FTYPE_MOSTLY_Q4_1;    break;
            case GGML_TYPE_Q5_0:    ftype = LLAMA_FTYPE_MOSTLY_Q5_0;    break;
            case GGML_TYPE_Q5_1:    ftype = LLAMA_FTYPE_MOSTLY_Q5_1;    break;
            case GGML_TYPE_Q8_0:    ftype = LLAMA_FTYPE_MOSTLY_Q8_0;    break;
            case GGML_TYPE_Q2_K:    ftype = LLAMA_FTYPE_MOSTLY_Q2_K;    break;
            case GGML_TYPE_Q3_K:    ftype = LLAMA_FTYPE_MOSTLY_Q3_K_M;  break;
            case GGML_TYPE_Q4_K:    ftype = LLAMA_FTYPE_MOSTLY_Q4_K_M;  break;
            case GGML_TYPE_Q5_K:    ftype = LLAMA_FTYPE_MOSTLY_Q5_K_M;  break;
            case GGML_TYPE_Q6_K:    ftype = LLAMA_FTYPE_MOSTLY_Q6_K;    break;
            case GGML_TYPE_TQ1_0:   ftype = LLAMA_FTYPE_MOSTLY_TQ1_0;   break;
            case GGML_TYPE_TQ2_0:   ftype = LLAMA_FTYPE_MOSTLY_TQ2_0;   break;
            case GGML_TYPE_IQ2_XXS: ftype = LLAMA_FTYPE_MOSTLY_IQ2_XXS; break;
            case GGML_TYPE_IQ2_XS:  ftype = LLAMA_FTYPE_MOSTLY_IQ2_XS;  break;
            case GGML_TYPE_IQ2_S:   ftype = LLAMA_FTYPE_MOSTLY_IQ2_S;   break;
            case GGML_TYPE_IQ3_XXS: ftype = LLAMA_FTYPE_MOSTLY_IQ3_XXS; break;
            case GGML_TYPE_IQ1_S:   ftype = LLAMA_FTYPE_MOSTLY_IQ1_S;   break;
            case GGML_TYPE_IQ1_M:   ftype = LLAMA_FTYPE_MOSTLY_IQ1_M;   break;
            case GGML_TYPE_IQ4_NL:  ftype = LLAMA_FTYPE_MOSTLY_IQ4_NL;  break;
            case GGML_TYPE_IQ4_XS:  ftype = LLAMA_FTYPE_MOSTLY_IQ4_XS;  break;
            case GGML_TYPE_IQ3_S:   ftype = LLAMA_FTYPE_MOSTLY_IQ3_S;   break;
            default:
                {
                    LLAMA_LOG_WARN("%s: unknown type %s\n", __func__, ggml_type_name(type_max));
                    ftype = LLAMA_FTYPE_ALL_F32;
                } break;
        }

        // this is a way to mark that we have "guessed" the file type
        ftype = (llama_ftype) (ftype | LLAMA_FTYPE_GUESSED);

        {
            uint32_t ftype_val = 0;
            if (get_key(LLM_KV_GENERAL_FILE_TYPE, ftype_val, false)) {
                ftype = (llama_ftype) ftype_val;
            }
        }

        LLAMA_LOG_INFO("%s: Dumping metadata keys/values. Note: KV overrides do not apply in this output.\n", __func__);

        for (int i = 0; i < n_kv; i++) {
            const char * name           = gguf_get_key(meta.get(), i);
            const enum gguf_type type   = gguf_get_kv_type(meta.get(), i);
            const std::string type_name =
                type == GGUF_TYPE_ARRAY
                ? format("%s[%s,%zu]", gguf_type_name(type), gguf_type_name(gguf_get_arr_type(meta.get(), i)), gguf_get_arr_n(meta.get(), i))
                : gguf_type_name(type);

            std::string value          = gguf_kv_to_str(meta.get(), i);
            const size_t MAX_VALUE_LEN = 40;
            if (value.size() > MAX_VALUE_LEN) {
                value = format("%s...", value.substr(0, MAX_VALUE_LEN - 3).c_str());
            }
            replace_all(value, "\n", "\\n");

            LLAMA_LOG_INFO("%s: - kv %3d: %42s %-16s = %s\n", __func__, i, name, type_name.c_str(), value.c_str());
        }

        // print type counts
        for (auto & kv : n_type) {
            if (kv.second == 0) {
                continue;
            }

            LLAMA_LOG_INFO("%s: - type %4s: %4d tensors\n", __func__, ggml_type_name(kv.first), kv.second);
        }
    }

    if (!llama_mmap::SUPPORTED) {
        LLAMA_LOG_WARN("%s: mmap is not supported on this platform\n", __func__);
        use_mmap = false;
    }

    this->use_mmap = use_mmap;
    this->check_tensors = check_tensors;
}